

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentSampledImage::~RenderFragmentSampledImage
          (RenderFragmentSampledImage *this)

{
  RenderFragmentSampledImage *this_local;
  
  (this->super_RenderPassCommand)._vptr_RenderPassCommand =
       (_func_int **)&PTR__RenderFragmentSampledImage_016aa718;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)20>_>::~Move(&this->m_sampler);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&this->m_imageView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&this->m_descriptorSet);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&this->m_descriptorPool);
  PipelineResources::~PipelineResources(&this->m_resources);
  RenderPassCommand::~RenderPassCommand(&this->super_RenderPassCommand);
  return;
}

Assistant:

RenderFragmentSampledImage::~RenderFragmentSampledImage (void)
{
}